

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceDirectional::~IfcLightSourceDirectional
          (IfcLightSourceDirectional *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  (this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x85f980;
  *(undefined8 *)&this->field_0x98 = 0x85f9f8;
  *(undefined8 *)
   &(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x85f9a8;
  *(undefined8 *)
   &(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x85f9d0;
  puVar1 = *(undefined1 **)
            &(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.field_0x30;
  puVar2 = &(this->super_IfcLightSource).field_0x40;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
    return;
  }
  return;
}

Assistant:

IfcLightSource() : Object("IfcLightSource") {}